

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulate.cc
# Opt level: O0

bool __thiscall
sfm::Triangulate::triangulate
          (Triangulate *this,
          vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *poses,
          vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *positions,
          Vec3d *track_pos,Statistics *stats,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *outliers)

{
  allocator<unsigned_long> *this_00;
  pointer *this_01;
  double dVar1;
  double dVar2;
  size_type sVar3;
  invalid_argument *piVar4;
  size_type sVar5;
  pointer ppCVar6;
  const_reference ppCVar7;
  const_reference pvVar8;
  double *pdVar9;
  reference ppCVar10;
  double dVar11;
  float fVar12;
  Vector<float,_2> local_200;
  Vector<float,_2> local_1f8;
  double local_1f0;
  double error;
  double local_1e0;
  undefined1 local_1d8 [8];
  Vec2d x2d;
  Vector<double,_3> local_1b0;
  undefined1 local_198 [8];
  Vec3d x;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp_outliers;
  double cos_angle;
  undefined1 local_140 [8];
  Vec3d ray1;
  undefined1 local_110 [8];
  Vec3d ray0;
  Vec3d camera_pos;
  undefined1 local_d8 [8];
  Vec3d tmp_pos;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> position_pair;
  vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> pose_pair;
  size_t p2;
  size_t p1;
  undefined1 local_78 [8];
  Vec3f best_pos;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_outliers;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *outliers_local;
  Statistics *stats_local;
  Vec3d *track_pos_local;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *positions_local;
  vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *poses_local;
  Triangulate *this_local;
  
  sVar3 = std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::size
                    (poses);
  if (sVar3 < 2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"At least two poses required");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar3 = std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::size
                    (poses);
  sVar5 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::size
                    (positions);
  if (sVar3 != sVar5) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Poses and positions size mismatch");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar3 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::size
                    (positions);
  this_00 = (allocator<unsigned_long> *)((long)best_pos.v + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(best_pos.v + 2),sVar3,this_00
            );
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)best_pos.v + 7));
  p1._4_4_ = 0;
  math::Vector<float,_3>::Vector((Vector<float,_3> *)local_78,(float *)((long)&p1 + 4));
  p2 = 0;
  do {
    sVar3 = std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::size
                      (poses);
    pose_pair.super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p2;
    if (sVar3 <= p2) {
      fVar12 = math::Vector<float,_3>::norm((Vector<float,_3> *)local_78);
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        sVar3 = std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::size
                          (poses);
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(best_pos.v + 2)
                          );
        if (sVar3 < sVar5 + (long)*(int *)(this + 0x10)) {
          if (stats != (Statistics *)0x0) {
            *(int *)(stats + 4) = *(int *)(stats + 4) + 1;
          }
          this_local._7_1_ = false;
        }
        else {
          math::Vector<double,3>::operator=
                    ((Vector<double,3> *)track_pos,(Vector<float,_3> *)local_78);
          if (stats != (Statistics *)0x0) {
            *(int *)stats = *(int *)stats + 1;
          }
          if (outliers != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
            std::swap<unsigned_long,std::allocator<unsigned_long>>
                      (outliers,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (best_pos.v + 2));
          }
          this_local._7_1_ = true;
        }
      }
      else {
        if (stats != (Statistics *)0x0) {
          *(int *)(stats + 0xc) = *(int *)(stats + 0xc) + 1;
        }
        this_local._7_1_ = false;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(best_pos.v + 2));
      return this_local._7_1_;
    }
    while( true ) {
      pose_pair.
      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)pose_pair.
                           super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      ppCVar6 = (pointer)std::
                         vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
                         size(poses);
      if (ppCVar6 <=
          pose_pair.
          super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) break;
      this_01 = &position_pair.
                 super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::vector
                ((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *)
                 this_01);
      std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::vector
                ((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                 (tmp_pos.v + 2));
      ppCVar7 = std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
                operator[](poses,p2);
      std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::push_back
                ((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *)
                 this_01,ppCVar7);
      ppCVar7 = std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
                operator[](poses,(size_type)
                                 pose_pair.
                                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::push_back
                ((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *)
                 &position_pair.
                  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,ppCVar7);
      pvVar8 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
               operator[](positions,p2);
      std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::push_back
                ((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                 (tmp_pos.v + 2),pvVar8);
      pvVar8 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
               operator[](positions,
                          (size_type)
                          pose_pair.
                          super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::push_back
                ((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                 (tmp_pos.v + 2),pvVar8);
      triangulate_track((Vector<double,_3> *)local_d8,
                        (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                        (tmp_pos.v + 2),
                        (vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *
                        )&position_pair.
                          super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
      dVar1 = *pdVar9;
      pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
      if ((dVar1 == *pdVar9) && (!NAN(dVar1) && !NAN(*pdVar9))) {
        pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
        dVar1 = *pdVar9;
        pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
        if ((dVar1 == *pdVar9) && (!NAN(dVar1) && !NAN(*pdVar9))) {
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
          dVar1 = *pdVar9;
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
          dVar11 = *pdVar9;
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
          dVar2 = *pdVar9;
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,0);
          if ((dVar1 - dVar11 != dVar2 - *pdVar9) || (NAN(dVar1 - dVar11) || NAN(dVar2 - *pdVar9)))
          goto LAB_0013da98;
        }
        pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
        dVar1 = *pdVar9;
        pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
        if ((dVar1 == *pdVar9) && (!NAN(dVar1) && !NAN(*pdVar9))) {
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
          dVar1 = *pdVar9;
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
          if ((dVar1 == *pdVar9) && (!NAN(dVar1) && !NAN(*pdVar9))) {
            pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
            dVar1 = *pdVar9;
            pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
            dVar11 = *pdVar9;
            pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
            dVar2 = *pdVar9;
            pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,1);
            if ((dVar1 - dVar11 != dVar2 - *pdVar9) || (NAN(dVar1 - dVar11) || NAN(dVar2 - *pdVar9))
               ) goto LAB_0013da98;
          }
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
          dVar1 = *pdVar9;
          pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
          if ((dVar1 == *pdVar9) && (!NAN(dVar1) && !NAN(*pdVar9))) {
            pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
            dVar1 = *pdVar9;
            pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
            if ((dVar1 == *pdVar9) && (!NAN(dVar1) && !NAN(*pdVar9))) {
              pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
              dVar1 = *pdVar9;
              pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
              dVar11 = *pdVar9;
              pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
              dVar2 = *pdVar9;
              pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_d8,2);
              if ((dVar1 - dVar11 != dVar2 - *pdVar9) ||
                 (NAN(dVar1 - dVar11) || NAN(dVar2 - *pdVar9))) goto LAB_0013da98;
            }
            if (0.0 < *(double *)(this + 8)) {
              math::Vector<double,_3>::Vector((Vector<double,_3> *)(ray0.v + 2));
              ppCVar10 = std::
                         vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
                         operator[]((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                     *)&position_pair.
                                        super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
              CameraPose::fill_camera_pos(*ppCVar10,(Vector<double,_3> *)(ray0.v + 2));
              math::Vector<double,_3>::operator-
                        ((Vector<double,_3> *)(ray1.v + 2),(Vector<double,_3> *)local_d8,
                         (Vector<double,_3> *)(ray0.v + 2));
              math::Vector<double,_3>::normalized
                        ((Vector<double,_3> *)local_110,(Vector<double,_3> *)(ray1.v + 2));
              ppCVar10 = std::
                         vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
                         operator[]((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                     *)&position_pair.
                                        super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
              CameraPose::fill_camera_pos(*ppCVar10,(Vector<double,_3> *)(ray0.v + 2));
              math::Vector<double,_3>::operator-
                        ((Vector<double,_3> *)&cos_angle,(Vector<double,_3> *)local_d8,
                         (Vector<double,_3> *)(ray0.v + 2));
              math::Vector<double,_3>::normalized
                        ((Vector<double,_3> *)local_140,(Vector<double,_3> *)&cos_angle);
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage =
                   (pointer)math::Vector<double,_3>::dot
                                      ((Vector<double,_3> *)local_110,(Vector<double,_3> *)local_140
                                      );
              if (*(double *)(this + 0x18) <=
                  (double)tmp_outliers.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage &&
                  (double)tmp_outliers.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage != *(double *)(this + 0x18))
              goto LAB_0013da98;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
            for (x.v[2] = 0.0; dVar1 = x.v[2],
                dVar11 = (double)std::
                                 vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                 ::size(poses), (ulong)dVar1 < (ulong)dVar11;
                x.v[2] = (double)((long)x.v[2] + 1)) {
              ppCVar7 = std::
                        vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
                        operator[](poses,(size_type)x.v[2]);
              math::Matrix<double,_3,_3>::operator*
                        (&local_1b0,&(*ppCVar7)->R,(Vector<double,_3> *)local_d8);
              ppCVar7 = std::
                        vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::
                        operator[](poses,(size_type)x.v[2]);
              math::Vector<double,_3>::operator+
                        ((Vector<double,_3> *)local_198,&local_1b0,&(*ppCVar7)->t);
              pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_198,2);
              if (0.0 < *pdVar9) {
                ppCVar7 = std::
                          vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                          ::operator[](poses,(size_type)x.v[2]);
                math::Matrix<double,_3,_3>::operator*
                          ((Vector<double,_3> *)(x2d.v + 1),&(*ppCVar7)->K,
                           (Vector<double,_3> *)local_198);
                math::Vector<double,_3>::operator=
                          ((Vector<double,_3> *)local_198,(Vector<double,_3> *)(x2d.v + 1));
                pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_198,0);
                dVar1 = *pdVar9;
                pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_198,2);
                local_1e0 = dVar1 / *pdVar9;
                pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_198,1);
                dVar1 = *pdVar9;
                pdVar9 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_198,2);
                error = dVar1 / *pdVar9;
                math::Vector<double,_2>::Vector((Vector<double,_2> *)local_1d8,&local_1e0,&error);
                pvVar8 = std::
                         vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
                         operator[](positions,(size_type)x.v[2]);
                math::Vector<float,_2>::Vector<double>(&local_200,(Vector<double,_2> *)local_1d8);
                math::Vector<float,_2>::operator-(&local_1f8,pvVar8);
                fVar12 = math::Vector<float,_2>::norm(&local_1f8);
                local_1f0 = (double)fVar12;
                if (*(double *)this <= local_1f0 && local_1f0 != *(double *)this) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                             (value_type_conflict3 *)(x.v + 2));
                }
              }
              else {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                           (value_type_conflict3 *)(x.v + 2));
              }
            }
            sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
            sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (best_pos.v + 2));
            if (sVar3 < sVar5) {
              math::Vector<float,3>::operator=
                        ((Vector<float,3> *)local_78,(Vector<double,_3> *)local_d8);
              std::swap<unsigned_long,std::allocator<unsigned_long>>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(best_pos.v + 2),
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
          }
        }
      }
LAB_0013da98:
      std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::~vector
                ((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                 (tmp_pos.v + 2));
      std::vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>::~vector
                ((vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *)
                 &position_pair.
                  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    p2 = p2 + 1;
  } while( true );
}

Assistant:

bool
Triangulate::triangulate (std::vector<CameraPose const*> const& poses,
    std::vector<math::Vec2f> const& positions,
    math::Vec3d* track_pos, Statistics* stats,
    std::vector<std::size_t>* outliers) const
{
    if (poses.size() < 2)
        throw std::invalid_argument("At least two poses required");
    if (poses.size() != positions.size())
        throw std::invalid_argument("Poses and positions size mismatch");

    /* Check all possible pose pairs for successful triangulation */
    std::vector<std::size_t> best_outliers(positions.size());
    math::Vec3f best_pos(0.0f);
    for (std::size_t p1 = 0; p1 < poses.size(); ++p1)
        for (std::size_t p2 = p1 + 1; p2 < poses.size(); ++p2)
        {
            /* Triangulate position from current pair */
            std::vector<CameraPose const*> pose_pair;
            std::vector<math::Vec2f> position_pair;
            pose_pair.push_back(poses[p1]);
            pose_pair.push_back(poses[p2]);
            position_pair.push_back(positions[p1]);
            position_pair.push_back(positions[p2]);
            math::Vec3d tmp_pos = triangulate_track(position_pair, pose_pair);
            if (MATH_ISNAN(tmp_pos[0]) || MATH_ISINF(tmp_pos[0]) ||
                MATH_ISNAN(tmp_pos[1]) || MATH_ISINF(tmp_pos[1]) ||
                MATH_ISNAN(tmp_pos[2]) || MATH_ISINF(tmp_pos[2]))
                continue;

            /* Check if pair has small triangulation angle. */
            if (this->opts.angle_threshold > 0.0)
            {
                math::Vec3d camera_pos;
                pose_pair[0]->fill_camera_pos(&camera_pos);
                math::Vec3d ray0 = (tmp_pos - camera_pos).normalized();
                pose_pair[1]->fill_camera_pos(&camera_pos);
                math::Vec3d ray1 = (tmp_pos - camera_pos).normalized();
                double const cos_angle = ray0.dot(ray1);
                if (cos_angle > this->cos_angle_thres)
                    continue;
            }

            /* Chek error in all input poses and find outliers. */
            std::vector<std::size_t> tmp_outliers;
            for (std::size_t i = 0; i < poses.size(); ++i)
            {
                math::Vec3d x = poses[i]->R * tmp_pos + poses[i]->t;

                /* Reject track if it appears behind the camera. */
                if (x[2] <= 0.0)
                {
                    tmp_outliers.push_back(i);
                    continue;
                }

                x = poses[i]->K * x;
                math::Vec2d x2d(x[0] / x[2], x[1] / x[2]);
                double error = (positions[i] - x2d).norm();
                if (error > this->opts.error_threshold)
                    tmp_outliers.push_back(i);
            }

            /* Select triangulation with lowest amount of outliers. */
            if (tmp_outliers.size() < best_outliers.size())
            {
                best_pos = tmp_pos;
                std::swap(best_outliers, tmp_outliers);
            }

        }

    /* If all pairs have small angles pos will be 0 here. */
    if (best_pos.norm() == 0.0f)
    {
        if (stats != nullptr)
            stats->num_too_small_angle += 1;
        return false;
    }

    /* Check if required number of inliers is found. */
    if (poses.size() < best_outliers.size() + this->opts.min_num_views)
    {
        if (stats != nullptr)
            stats->num_large_error += 1;
        return false;
    }

    /* Return final position and outliers. */
    *track_pos = best_pos;
    if (stats != nullptr)
        stats->num_new_tracks += 1;
    if (outliers != nullptr)
        std::swap(*outliers, best_outliers);

    return true;
}